

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O0

void cpu_tick(nes_system *system)

{
  int iVar1;
  cpu_state cVar2;
  bool local_29;
  undefined8 local_28;
  undefined8 local_20;
  nes_system_state *state;
  nes_system *system_local;
  
  if ((((system->config).cpu_callback != (_func_void_uint16_t_cpu_state_ptr_void_ptr *)0x0) &&
      ((char)(system->state).cpu.cycle == '\0')) &&
     (((byte)(system->state).cpu.field_0x9 >> 1 & 1) == 0)) {
    (*(system->config).cpu_callback)
              ((system->state).cpu.address,(cpu_state *)system,(system->config).client_data);
  }
  cVar2 = cpu_execute((system->state).cpu);
  local_28 = cVar2._0_8_;
  (system->state).cpu.cycle = (undefined2)local_28;
  (system->state).cpu.PC = local_28._2_2_;
  (system->state).cpu.S = local_28._4_1_;
  (system->state).cpu.P = local_28._5_1_;
  (system->state).cpu.address = local_28._6_2_;
  local_20 = cVar2._8_8_;
  (system->state).cpu.rw_mode = (undefined1)local_20;
  (system->state).cpu.field_0x9 = local_20._1_1_;
  (system->state).cpu.data = local_20._2_1_;
  (system->state).cpu.temp = local_20._3_1_;
  (system->state).cpu.A = local_20._4_1_;
  (system->state).cpu.X = local_20._5_1_;
  (system->state).cpu.Y = local_20._6_1_;
  (system->state).cpu.field_0xf = local_20._7_1_;
  local_29 = true;
  if ((system->state).dmc_dma == 0) {
    local_29 = (system->state).oam_dma != 0;
  }
  (system->state).cpu.field_0x9 = (system->state).cpu.field_0x9 & 0xfe | (local_29 ^ 0xffU) & 1;
  if ((((system->state).cpu.field_0x9 & 1) == 0) &&
     (((byte)(system->state).cpu.field_0x9 >> 1 & 1) != 0)) {
    if ((system->state).dmc_dma == 0) {
      iVar1 = oam_dma_execute(system);
    }
    else {
      iVar1 = dmc_dma_execute(system);
    }
    if (iVar1 == 0) goto LAB_00104616;
  }
  cpu_mem_rw(system);
  cpu_ppu_bus(system);
  cpu_apu_bus(system);
  cpu_joy_bus(system);
  cpu_oam_dma_bus(system);
LAB_00104616:
  (system->state).cpu_odd_cycle = (system->state).cpu_odd_cycle ^ 1;
  return;
}

Assistant:

static void cpu_tick(nes_system* system)
{
    nes_system_state* state = &system->state;

    if (system->config.cpu_callback && (uint8_t)state->cpu.cycle == 0 && !state->cpu.halted)
        system->config.cpu_callback(state->cpu.address, &state->cpu, system->config.client_data);

    state->cpu = cpu_execute(state->cpu);

    state->cpu.rdy = !(state->dmc_dma || state->oam_dma);

    if (state->cpu.rdy || !state->cpu.halted || (state->dmc_dma ? dmc_dma_execute(system) : oam_dma_execute(system)))
    {
        cpu_mem_rw(system);
        cpu_ppu_bus(system);
        cpu_apu_bus(system);
        cpu_joy_bus(system);
        cpu_oam_dma_bus(system);
    }

    state->cpu_odd_cycle ^= 1; 
}